

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceOuterBound,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcFaceBound *this;
  
  this = (IfcFaceBound *)operator_new(0x80);
  *(undefined ***)&this->field_0x68 = &PTR__Object_008048a0;
  this[1].super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  *(char **)&this[1].super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 =
       "IfcFaceOuterBound";
  Assimp::IFC::Schema_2x3::IfcFaceBound::IfcFaceBound(this,&PTR_construction_vtable_24__00899ad8);
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceOuterBound_00899a20;
  *(undefined ***)&this->field_0x68 = &PTR__IfcFaceOuterBound_00899ac0;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceOuterBound_00899a48;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceOuterBound_00899a70;
  *(undefined ***)&this->field_0x58 = &PTR__IfcFaceOuterBound_00899a98;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFaceOuterBound>(db,params,(IfcFaceOuterBound *)this);
  return (Object *)
         ((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }